

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

float baryonyx::itm::compute_delta<float,baryonyx::itm::default_cost_type<float>>
                (context *ctx,default_cost_type<float> *c,float theta,int n)

{
  undefined1 auVar1 [16];
  float local_28;
  float local_24;
  float ret;
  float mini;
  int n_local;
  float theta_local;
  default_cost_type<float> *c_local;
  context *ctx_local;
  
  ret = (float)n;
  mini = theta;
  _n_local = c;
  c_local = (default_cost_type<float> *)ctx;
  info<>(ctx,"  - delta not defined, compute it:\n");
  local_24 = default_cost_type<float>::min(_n_local,(int)ret);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_24),ZEXT416((uint)-mini),ZEXT416((uint)local_24));
  local_28 = auVar1._0_4_;
  info<float,float,float>
            ((context *)c_local,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_28,
             &local_24,&mini);
  return local_28;
}

Assistant:

inline Float
compute_delta(const context& ctx, const Cost& c, Float theta, int n)
{
    info(ctx, "  - delta not defined, compute it:\n");

    const auto mini = c.min(n);
    const auto ret = mini - theta * mini;

    info(ctx,
         "    - delta={} (min normalized cost:{} / theta: {})\n",
         ret,
         mini,
         theta);

    return ret;
}